

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFImporter::ImportMaterials(glTFImporter *this,Asset *r)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  aiMaterial **ppaVar4;
  aiMaterial *paVar5;
  undefined1 local_444 [8];
  aiString str;
  Material *mat;
  aiMaterial *aimat;
  uint i;
  Asset *r_local;
  glTFImporter *this_local;
  
  uVar2 = glTF::LazyDict<glTF::Material>::Size(&r->materials);
  this->mScene->mNumMaterials = uVar2;
  auVar1 = ZEXT416(this->mScene->mNumMaterials) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppaVar4 = (aiMaterial **)operator_new__(uVar3);
  this->mScene->mMaterials = ppaVar4;
  for (aimat._4_4_ = 0; aimat._4_4_ < this->mScene->mNumMaterials; aimat._4_4_ = aimat._4_4_ + 1) {
    paVar5 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar5);
    this->mScene->mMaterials[aimat._4_4_] = paVar5;
    str.data._1016_8_ = glTF::LazyDict<glTF::Material>::operator[](&r->materials,(ulong)aimat._4_4_)
    ;
    aiString::aiString((aiString *)local_444,&(((Material *)str.data._1016_8_)->super_Object).id);
    aiMaterial::AddProperty(paVar5,(aiString *)local_444,"?mat.name",0,0);
    SetMaterialColorProperty
              (&this->embeddedTexIdxs,r,*(TexProperty *)(str.data._1016_8_ + 0x48),paVar5,
               aiTextureType_AMBIENT,"$clr.ambient",0,0);
    SetMaterialColorProperty
              (&this->embeddedTexIdxs,r,*(TexProperty *)(str.data._1016_8_ + 0x68),paVar5,
               aiTextureType_DIFFUSE,"$clr.diffuse",0,0);
    SetMaterialColorProperty
              (&this->embeddedTexIdxs,r,*(TexProperty *)(str.data._1016_8_ + 0x88),paVar5,
               aiTextureType_SPECULAR,"$clr.specular",0,0);
    SetMaterialColorProperty
              (&this->embeddedTexIdxs,r,*(TexProperty *)(str.data._1016_8_ + 0xa8),paVar5,
               aiTextureType_EMISSIVE,"$clr.emissive",0,0);
    aiMaterial::AddProperty<bool>(paVar5,(bool *)(str.data._1016_8_ + 200),1,"$mat.twosided",0,0);
    if (((*(byte *)(str.data._1016_8_ + 0xc9) & 1) != 0) &&
       ((*(float *)(str.data._1016_8_ + 0xcc) != 1.0 || (NAN(*(float *)(str.data._1016_8_ + 0xcc))))
       )) {
      aiMaterial::AddProperty(paVar5,(float *)(str.data._1016_8_ + 0xcc),1,"$mat.opacity",0,0);
    }
    if (0.0 < *(float *)(str.data._1016_8_ + 0xd0)) {
      aiMaterial::AddProperty(paVar5,(float *)(str.data._1016_8_ + 0xd0),1,"$mat.shininess",0,0);
    }
  }
  if (this->mScene->mNumMaterials == 0) {
    this->mScene->mNumMaterials = 1;
    ppaVar4 = this->mScene->mMaterials;
    if (ppaVar4 != (aiMaterial **)0x0) {
      operator_delete__(ppaVar4);
    }
    ppaVar4 = (aiMaterial **)operator_new__(8);
    this->mScene->mMaterials = ppaVar4;
    paVar5 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar5);
    *this->mScene->mMaterials = paVar5;
  }
  return;
}

Assistant:

void glTFImporter::ImportMaterials(glTF::Asset& r) {
    mScene->mNumMaterials = unsigned(r.materials.Size());
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials];

    for (unsigned int i = 0; i < mScene->mNumMaterials; ++i) {
        aiMaterial* aimat = mScene->mMaterials[i] = new aiMaterial();

        Material& mat = r.materials[i];

        /*if (!mat.name.empty())*/ {
            aiString str(mat.id /*mat.name*/);
            aimat->AddProperty(&str, AI_MATKEY_NAME);
        }

        SetMaterialColorProperty(embeddedTexIdxs, r, mat.ambient,  aimat, aiTextureType_AMBIENT,  AI_MATKEY_COLOR_AMBIENT );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.diffuse,  aimat, aiTextureType_DIFFUSE,  AI_MATKEY_COLOR_DIFFUSE );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.specular, aimat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.emission, aimat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);

        aimat->AddProperty(&mat.doubleSided, 1, AI_MATKEY_TWOSIDED);

        if (mat.transparent && (mat.transparency != 1.0f)) {
            aimat->AddProperty(&mat.transparency, 1, AI_MATKEY_OPACITY);
        }

        if (mat.shininess > 0.f) {
            aimat->AddProperty(&mat.shininess, 1, AI_MATKEY_SHININESS);
        }
    }

    if (mScene->mNumMaterials == 0) {
        mScene->mNumMaterials = 1;
        // Delete the array of length zero created above.
        delete[] mScene->mMaterials;
        mScene->mMaterials = new aiMaterial*[1];
        mScene->mMaterials[0] = new aiMaterial();
    }
}